

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_zone.hpp
# Opt level: O0

void __thiscall msgpack::v1::zone::chunk_list::chunk_list(chunk_list *this,size_t chunk_size)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long in_RSI;
  bad_alloc *in_RDI;
  chunk *c;
  
  puVar1 = (undefined8 *)malloc(in_RSI + 8);
  if (puVar1 == (undefined8 *)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_RDI);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *(undefined8 **)(in_RDI + 0x10) = puVar1;
  *(long *)in_RDI = in_RSI;
  *(undefined8 **)(in_RDI + 8) = puVar1 + 1;
  *puVar1 = 0;
  return;
}

Assistant:

chunk_list(size_t chunk_size)
        {
            chunk* c = static_cast<chunk*>(::malloc(sizeof(chunk) + chunk_size));
            if(!c) {
                throw std::bad_alloc();
            }

            m_head = c;
            m_free = chunk_size;
            m_ptr  = reinterpret_cast<char*>(c) + sizeof(chunk);
            c->m_next = MSGPACK_NULLPTR;
        }